

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSetupScrollFreeze(int columns,int rows)

{
  ImVec2 *pIVar1;
  float *pfVar2;
  ImGuiTable *pIVar3;
  ImGuiTableColumn *pIVar4;
  ulong uVar5;
  char cVar6;
  ulong uVar7;
  long lVar8;
  ImGuiTableColumn *pIVar9;
  char *pcVar10;
  ImGuiTableColumnIdx IVar11;
  char *pcVar12;
  char *pcVar13;
  ImGuiTableColumn *pIVar14;
  ImGuiTableColumnIdx IVar15;
  
  pIVar3 = GImGui->CurrentTable;
  if (pIVar3 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableSetupColumn() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c2,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (pIVar3->IsLayoutLocked != false) {
    __assert_fail("table->IsLayoutLocked == false && \"Need to call TableSetupColumn() before first row!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c3,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (0x3f < (uint)columns) {
    __assert_fail("columns >= 0 && columns < 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c4,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  if (0x7f < (uint)rows) {
    __assert_fail("rows >= 0 && rows < 128",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_tables.cpp"
                  ,0x5c5,"void ImGui::TableSetupScrollFreeze(int, int)");
  }
  uVar7 = 0;
  if ((((uint)pIVar3->Flags >> 0x18 & 1) != 0) &&
     (uVar7 = (ulong)(uint)pIVar3->ColumnsCount, columns < pIVar3->ColumnsCount)) {
    uVar7 = (ulong)(uint)columns;
  }
  cVar6 = (char)uVar7;
  pIVar3->FreezeColumnsRequest = cVar6;
  pIVar1 = &pIVar3->InnerWindow->Scroll;
  IVar15 = '\0';
  if (pIVar1->x != 0.0) {
    IVar15 = cVar6;
  }
  if (NAN(pIVar1->x)) {
    IVar15 = cVar6;
  }
  pIVar3->FreezeColumnsCount = IVar15;
  if (((uint)pIVar3->Flags >> 0x19 & 1) == 0) {
    rows = 0;
  }
  IVar11 = (ImGuiTableColumnIdx)rows;
  pIVar3->FreezeRowsRequest = IVar11;
  pfVar2 = &(pIVar3->InnerWindow->Scroll).y;
  IVar15 = '\0';
  if (*pfVar2 != 0.0) {
    IVar15 = IVar11;
  }
  if (NAN(*pfVar2)) {
    IVar15 = IVar11;
  }
  pIVar3->FreezeRowsCount = IVar15;
  pIVar3->IsUnfrozenRows = IVar15 == '\0';
  if ('\0' < cVar6) {
    uVar5 = 0;
    do {
      pcVar13 = (pIVar3->DisplayOrderToIndex).Data;
      pcVar12 = (pIVar3->DisplayOrderToIndex).DataEnd;
      pcVar10 = pcVar13 + uVar5;
      if (pcVar12 <= pcVar10) {
LAB_001962db:
        pcVar10 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
LAB_00196307:
        __assert_fail("p >= Data && p < DataEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui_internal.h"
                      ,599,pcVar10);
      }
      cVar6 = *pcVar10;
      if ((char)uVar7 <= cVar6 && uVar5 != (uint)(int)cVar6) {
        if ((-1 < cVar6) && (pcVar13 = pcVar13 + cVar6, pcVar13 < pcVar12)) {
          lVar8 = (long)*pcVar13;
          if (-1 < lVar8) {
            pIVar14 = (pIVar3->Columns).Data;
            pIVar4 = (pIVar3->Columns).DataEnd;
            pIVar9 = pIVar14 + lVar8;
            if ((pIVar9 < pIVar4) && (pIVar14 = pIVar14 + cVar6, pIVar14 < pIVar4)) {
              IVar15 = pIVar9->DisplayOrder;
              pIVar9->DisplayOrder = pIVar14->DisplayOrder;
              pIVar14->DisplayOrder = IVar15;
              pcVar10 = (pIVar3->DisplayOrderToIndex).Data;
              pcVar13 = (pIVar3->DisplayOrderToIndex).DataEnd;
              pcVar12 = pcVar10 + cVar6;
              if ((pcVar12 < pcVar13) && (pcVar10 = pcVar10 + uVar5, pcVar10 < pcVar13)) {
                cVar6 = *pcVar12;
                *pcVar12 = *pcVar10;
                *pcVar10 = cVar6;
                goto LAB_001962c5;
              }
              goto LAB_001962db;
            }
          }
          pcVar10 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
          goto LAB_00196307;
        }
        goto LAB_001962db;
      }
LAB_001962c5:
      uVar5 = uVar5 + 1;
      uVar7 = (ulong)pIVar3->FreezeColumnsRequest;
    } while ((long)uVar5 < (long)uVar7);
  }
  return;
}

Assistant:

void ImGui::TableSetupScrollFreeze(int columns, int rows)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableSetupColumn() after BeginTable()!");
    IM_ASSERT(table->IsLayoutLocked == false && "Need to call TableSetupColumn() before first row!");
    IM_ASSERT(columns >= 0 && columns < IMGUI_TABLE_MAX_COLUMNS);
    IM_ASSERT(rows >= 0 && rows < 128); // Arbitrary limit

    table->FreezeColumnsRequest = (table->Flags & ImGuiTableFlags_ScrollX) ? (ImGuiTableColumnIdx)ImMin(columns, table->ColumnsCount) : 0;
    table->FreezeColumnsCount = (table->InnerWindow->Scroll.x != 0.0f) ? table->FreezeColumnsRequest : 0;
    table->FreezeRowsRequest = (table->Flags & ImGuiTableFlags_ScrollY) ? (ImGuiTableColumnIdx)rows : 0;
    table->FreezeRowsCount = (table->InnerWindow->Scroll.y != 0.0f) ? table->FreezeRowsRequest : 0;
    table->IsUnfrozenRows = (table->FreezeRowsCount == 0); // Make sure this is set before TableUpdateLayout() so ImGuiListClipper can benefit from it.b

    // Ensure frozen columns are ordered in their section. We still allow multiple frozen columns to be reordered.
    // FIXME-TABLE: This work for preserving 2143 into 21|43. How about 4321 turning into 21|43? (preserve relative order in each section)
    for (int column_n = 0; column_n < table->FreezeColumnsRequest; column_n++)
    {
        int order_n = table->DisplayOrderToIndex[column_n];
        if (order_n != column_n && order_n >= table->FreezeColumnsRequest)
        {
            ImSwap(table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder, table->Columns[table->DisplayOrderToIndex[column_n]].DisplayOrder);
            ImSwap(table->DisplayOrderToIndex[order_n], table->DisplayOrderToIndex[column_n]);
        }
    }
}